

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O0

void __thiscall ZXing::BitMatrix::BitMatrix(BitMatrix *this,int width,int height)

{
  int iVar1;
  allocator_type *__value;
  size_type __n;
  invalid_argument *this_00;
  int in_EDX;
  int in_ESI;
  allocator_type *in_RDI;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  int local_10;
  int local_c;
  
  *(int *)in_RDI = in_ESI;
  *(int *)(in_RDI + 4) = in_EDX;
  __value = in_RDI + 8;
  __n = (size_type)(in_ESI * in_EDX);
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffef;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x21bed2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (this_01,__n,(value_type_conflict *)__value,in_RDI);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x21bef9);
  if (local_c != 0) {
    iVar1 = Size<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar1 / local_c != local_10) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid size: width * height is too big");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

BitMatrix(int width, int height) : _width(width), _height(height), _bits(width * height, UNSET_V)
	{
		if (width != 0 && Size(_bits) / width != height)
			throw std::invalid_argument("Invalid size: width * height is too big");
	}